

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<std::__cxx11::string,double>::
insert<google::protobuf::Map<std::__cxx11::string,double>::const_iterator>
          (Map<std::__cxx11::string,double> *this,const_iterator first,const_iterator last)

{
  double dVar1;
  bool bVar2;
  const_pointer pvVar3;
  double *pdVar4;
  iterator local_58;
  undefined1 local_40 [8];
  iterator exist_it;
  const_iterator it;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_local;
  
  exist_it.it_.bucket_index_ = (size_type)first.it_.node_;
  while (bVar2 = protobuf::operator!=((const_iterator *)&exist_it.it_.bucket_index_,&last), bVar2) {
    pvVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
             ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    find((iterator *)local_40,
         (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          *)this,&pvVar3->first);
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    end(&local_58,
        (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
         *)this);
    bVar2 = protobuf::operator==((iterator *)local_40,&local_58);
    if (bVar2) {
      pvVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
      dVar1 = pvVar3->second;
      pvVar3 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               ::const_iterator::operator->((const_iterator *)&exist_it.it_.bucket_index_);
      pdVar4 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
               ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                             *)this,&pvVar3->first);
      *pdVar4 = dVar1;
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    const_iterator::operator++((const_iterator *)&exist_it.it_.bucket_index_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }